

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

void BinaryenBlockInsertChildAt
               (BinaryenExpressionRef expr,BinaryenIndex index,BinaryenExpressionRef childExpr)

{
  if (expr->_id != BlockId) {
    __assert_fail("expression->is<Block>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0x809,
                  "void BinaryenBlockInsertChildAt(BinaryenExpressionRef, BinaryenIndex, BinaryenExpressionRef)"
                 );
  }
  if (childExpr != (BinaryenExpressionRef)0x0) {
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::insertAt
              ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)(expr + 2),
               (ulong)index,childExpr);
    return;
  }
  __assert_fail("childExpr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                ,0x80a,
                "void BinaryenBlockInsertChildAt(BinaryenExpressionRef, BinaryenIndex, BinaryenExpressionRef)"
               );
}

Assistant:

void BinaryenBlockInsertChildAt(BinaryenExpressionRef expr,
                                BinaryenIndex index,
                                BinaryenExpressionRef childExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<Block>());
  assert(childExpr);
  static_cast<Block*>(expression)->list.insertAt(index, (Expression*)childExpr);
}